

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  bool bVar1;
  allocator<char> local_89;
  string local_88;
  UnitTestFilter local_68;
  char *local_18;
  char *filter_local;
  string *name_str_local;
  
  local_18 = filter;
  filter_local = (char *)name_str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,filter,&local_89);
  anon_unknown_28::UnitTestFilter::UnitTestFilter(&local_68,&local_88);
  bVar1 = anon_unknown_28::UnitTestFilter::MatchesName(&local_68,(string *)filter_local);
  anon_unknown_28::UnitTestFilter::~UnitTestFilter(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return bVar1;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}